

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O2

int __thiscall libtorrent::aux::count_leading_zeros_sw(aux *this,span<const_unsigned_int> buf)

{
  uint uVar1;
  int in_EAX;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar4 = (uint)buf.m_ptr;
  uVar3 = 0;
  if (0 < (int)uVar4) {
    uVar3 = (ulong)uVar4;
  }
  iVar5 = -0x1f;
  do {
    if (uVar3 == uVar6) {
LAB_001abd4f:
      iVar5 = uVar4 << 5;
      if ((long)uVar6 < (long)(int)uVar4) {
        iVar5 = in_EAX;
      }
      return iVar5;
    }
    uVar1 = *(uint *)(this + uVar6 * 4);
    if (uVar1 != 0) {
      iVar2 = log2p1(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
                    );
      in_EAX = -(iVar2 + iVar5);
      goto LAB_001abd4f;
    }
    uVar6 = uVar6 + 1;
    iVar5 = iVar5 + -0x20;
    in_EAX = 0;
  } while( true );
}

Assistant:

int count_leading_zeros_sw(span<std::uint32_t const> buf)
	{
		auto const num = int(buf.size());
		std::uint32_t const* ptr = buf.data();

		TORRENT_ASSERT(num >= 0);
		TORRENT_ASSERT(ptr != nullptr);

		for (int i = 0; i < num; i++)
		{
			if (ptr[i] == 0) continue;
			return i * 32 + 31 - log2p1(aux::network_to_host(ptr[i]));
		}

		return num * 32;
	}